

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_heat_maps.h
# Opt level: O2

double __thiscall
Gudhi::Persistence_representations::
Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>::project_to_R
          (Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>
           *this,int number_of_function)

{
  pointer pvVar1;
  long lVar2;
  size_t i;
  long lVar3;
  size_t j;
  long lVar4;
  double dVar5;
  
  pvVar1 = (this->heat_map).
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  dVar5 = 0.0;
  for (lVar3 = 0;
      lVar3 != ((long)(this->heat_map).
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1) / 0x18;
      lVar3 = lVar3 + 1) {
    lVar2 = *(long *)&pvVar1[lVar3].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data;
    for (lVar4 = 0;
        (long)*(pointer *)
               ((long)&pvVar1[lVar3].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data + 8) - lVar2 >> 3 != lVar4; lVar4 = lVar4 + 1) {
      dVar5 = dVar5 + *(double *)(lVar2 + lVar4 * 8);
    }
  }
  return dVar5;
}

Assistant:

double Persistence_heat_maps<Scalling_of_kernels>::project_to_R(int number_of_function) const {
  double result = 0;
  for (size_t i = 0; i != this->heat_map.size(); ++i) {
    for (size_t j = 0; j != this->heat_map[i].size(); ++j) {
      result += this->heat_map[i][j];
    }
  }
  return result;
}